

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O3

void read_random(void)

{
  istream *piVar1;
  double r;
  ifstream ifi_r;
  double local_228;
  double local_220 [65];
  
  std::ifstream::ifstream(local_220,"random.txt",_S_in);
  while( true ) {
    piVar1 = std::istream::_M_extract<double>(local_220);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if (random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&random_,
                 (iterator)
                 random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_228);
    }
    else {
      *random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_228;
      random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = random_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void read_random() {
	ifstream ifi_r("random.txt");
	double r;
	while(ifi_r >> r)random_.push_back(r);
}